

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_ad0985::cmAppendPathSegmentGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmAppendPathSegmentGenerator *this,string *parent)

{
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  string *local_20;
  string *parent_local;
  cmAppendPathSegmentGenerator *this_local;
  
  local_20 = parent;
  parent_local = (string *)this;
  this_local = (cmAppendPathSegmentGenerator *)__return_storage_ptr__;
  if ((this->NeedReset & 1U) == 0) {
    this->NeedReset = true;
    cmAlphaNum::cmAlphaNum(&local_50,parent);
    cmAlphaNum::cmAlphaNum(&local_80,'/');
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_50,&local_80,&this->DirName);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->NeedReset) {
      return {};
    }
    this->NeedReset = true;
    return cmStrCat(parent, '/', this->DirName);
  }